

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Reference *v)

{
  stringstream ss;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  ::std::operator<<(local_1a0,(AssetPath *)this);
  if (this[0x108] == (tinyusdz)0x1) {
    ::std::operator<<(local_1a0,(Path *)(this + 0x40));
  }
  ::std::operator<<(local_1a0,(LayerOffset *)(this + 0x110));
  if (*(long *)(this + 0x148) != 0) {
    ::std::__cxx11::string::string((string *)&local_1f0,"customData",&local_1f1);
    print_customData(&local_1d0,(CustomDataType *)(this + 0x120),&local_1f0,0);
    ::std::operator<<(local_1a0,(string *)&local_1d0);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Reference &v) {
  std::stringstream ss;

  ss << v.asset_path;
  if (v.prim_path.is_valid()) {
    ss << v.prim_path;
  }

  ss << v.layerOffset;

  if (!v.customData.empty()) {
    // TODO: Indent
    ss << print_customData(v.customData, "customData", /* indent */ 0);
  }

  return ss.str();
}